

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3MaxLevel(Fts3Table *p,int *pnMax)

{
  int iVar1;
  int *in_RSI;
  sqlite3_stmt *pStmt;
  int mxLevel;
  int rc;
  sqlite3_value **in_stack_00000148;
  sqlite3_stmt **in_stack_00000150;
  int in_stack_0000015c;
  Fts3Table *in_stack_00000160;
  int in_stack_ffffffffffffffdc;
  sqlite3_stmt *pStmt_00;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 0;
  pStmt_00 = (sqlite3_stmt *)0x0;
  local_14 = fts3SqlStmt(in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_00000148);
  if (local_14 == 0) {
    iVar1 = sqlite3_step(pStmt);
    if (iVar1 == 100) {
      local_18 = sqlite3_column_int(pStmt_00,in_stack_ffffffffffffffdc);
    }
    local_14 = sqlite3_reset(pStmt_00);
  }
  *in_RSI = local_18;
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MaxLevel(Fts3Table *p, int *pnMax){
  int rc;
  int mxLevel = 0;
  sqlite3_stmt *pStmt = 0;

  rc = fts3SqlStmt(p, SQL_SELECT_MXLEVEL, &pStmt, 0);
  if( rc==SQLITE_OK ){
    if( SQLITE_ROW==sqlite3_step(pStmt) ){
      mxLevel = sqlite3_column_int(pStmt, 0);
    }
    rc = sqlite3_reset(pStmt);
  }
  *pnMax = mxLevel;
  return rc;
}